

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

wchar_t prt_level_short(wchar_t row,wchar_t col)

{
  size_t sVar1;
  char local_38 [8];
  char tmp [32];
  wchar_t col_local;
  wchar_t row_local;
  
  strnfmt(local_38,0x20,"%d",(ulong)(uint)(int)player->lev);
  if (player->lev < player->max_lev) {
    put_str("l:",row,col);
    c_put_str('\v',local_38,row,col + L'\x02');
  }
  else {
    put_str("L:",row,col);
    c_put_str('\r',local_38,row,col + L'\x02');
  }
  sVar1 = strlen(local_38);
  return (int)sVar1 + L'\x03';
}

Assistant:

static int prt_level_short(int row, int col)
{
	char tmp[32];

	strnfmt(tmp, sizeof(tmp), "%d", player->lev);

	if (player->lev >= player->max_lev) {
		put_str("L:", row, col);
		c_put_str(COLOUR_L_GREEN, tmp, row, col + 2);
	} else {
		put_str("l:", row, col);
		c_put_str(COLOUR_YELLOW, tmp, row, col + 2);
	}

	return 3+strlen(tmp);
}